

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O0

Expression * __thiscall
wasm::Flatten::getPreludesWithExpression(Flatten *this,Expression *preluder,Expression *after)

{
  bool bVar1;
  pointer ppVar2;
  Module *wasm;
  Builder local_50;
  Flatten *local_48;
  Block *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *thePreludes;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_30;
  iterator iter;
  Expression *after_local;
  Expression *preluder_local;
  Flatten *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
               )after;
  after_local = preluder;
  preluder_local = (Expression *)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
       ::find(&this->preludes,&after_local);
  thePreludes = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                std::
                unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ::end(&this->preludes);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                      *)&thePreludes);
  if (bVar1) {
    this_local = (Flatten *)
                 iter.
                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                 ._M_cur;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                           *)&local_30);
    ret = (Block *)&ppVar2->second;
    wasm = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getModule
                     ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *
                      )&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     );
    Builder::Builder(&local_50,wasm);
    local_48 = (Flatten *)
               Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         (&local_50,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)ret);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::clear
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)ret);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &(local_48->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                ).super_Pass.name.field_2,
               (Expression *)
               iter.
               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
               ._M_cur);
    Block::finalize((Block *)local_48);
    this_local = local_48;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* getPreludesWithExpression(Expression* preluder,
                                        Expression* after) {
    auto iter = preludes.find(preluder);
    if (iter == preludes.end()) {
      return after;
    }
    // we have preludes
    auto& thePreludes = iter->second;
    auto* ret = Builder(*getModule()).makeBlock(thePreludes);
    thePreludes.clear();
    ret->list.push_back(after);
    ret->finalize();
    return ret;
  }